

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_xmlRegisterErrorHandler(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  PyObject *pyobj_ctx;
  PyObject *pyobj_f;
  
  pPVar2 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"OO:xmlRegisterErrorHandler",&pyobj_f,&pyobj_ctx);
  if (iVar1 != 0) {
    if (libxml_xmlPythonErrorFuncHandler != (PyObject *)0x0) {
      _Py_DECREF(libxml_xmlPythonErrorFuncHandler);
    }
    if (libxml_xmlPythonErrorFuncCtxt != (PyObject *)0x0) {
      _Py_DECREF(libxml_xmlPythonErrorFuncCtxt);
    }
    if (pyobj_ctx != (PyObject *)0x0) {
      pyobj_ctx->ob_refcnt = pyobj_ctx->ob_refcnt + 1;
    }
    if (pyobj_f != (PyObject *)0x0) {
      pyobj_f->ob_refcnt = pyobj_f->ob_refcnt + 1;
    }
    libxml_xmlPythonErrorFuncHandler = pyobj_f;
    libxml_xmlPythonErrorFuncCtxt = pyobj_ctx;
    pPVar2 = libxml_intWrap(1);
  }
  return pPVar2;
}

Assistant:

static PyObject *
libxml_xmlRegisterErrorHandler(ATTRIBUTE_UNUSED PyObject * self,
                               PyObject * args)
{
    PyObject *py_retval;
    PyObject *pyobj_f;
    PyObject *pyobj_ctx;

    if (!PyArg_ParseTuple
        (args, (char *) "OO:xmlRegisterErrorHandler", &pyobj_f,
         &pyobj_ctx))
        return (NULL);

#ifdef DEBUG_ERROR
    printf("libxml_xmlRegisterErrorHandler(%p, %p) called\n", pyobj_ctx,
           pyobj_f);
#endif

    if (libxml_xmlPythonErrorFuncHandler != NULL) {
        Py_XDECREF(libxml_xmlPythonErrorFuncHandler);
    }
    if (libxml_xmlPythonErrorFuncCtxt != NULL) {
        Py_XDECREF(libxml_xmlPythonErrorFuncCtxt);
    }

    Py_XINCREF(pyobj_ctx);
    Py_XINCREF(pyobj_f);

    /* TODO: check f is a function ! */
    libxml_xmlPythonErrorFuncHandler = pyobj_f;
    libxml_xmlPythonErrorFuncCtxt = pyobj_ctx;

    py_retval = libxml_intWrap(1);
    return (py_retval);
}